

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_list.cpp
# Opt level: O3

PGList * duckdb_libpgquery::list_truncate(PGList *list,int new_size)

{
  PGListCell *pPVar1;
  int iVar2;
  
  if (list == (PGList *)0x0 || new_size < 1) {
    return (PGList *)0x0;
  }
  if (new_size < list->length) {
    iVar2 = new_size;
    for (pPVar1 = list->head; pPVar1 != (PGListCell *)0x0; pPVar1 = pPVar1->next) {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        pPVar1->next = (PGListCell *)0x0;
        list->tail = pPVar1;
        list->length = new_size;
        return list;
      }
    }
  }
  return list;
}

Assistant:

PGList *
list_truncate(PGList *list, int new_size)
{
	PGListCell   *cell;
	int			n;

	if (new_size <= 0)
		return NIL;				/* truncate to zero length */

	/* If asked to effectively extend the list, do nothing */
	if (new_size >= list_length(list))
		return list;

	n = 1;
	foreach(cell, list)
	{
		if (n == new_size)
		{
			cell->next = NULL;
			list->tail = cell;
			list->length = new_size;
			check_list_invariants(list);
			return list;
		}
		n++;
	}

	/* keep the compiler quiet; never reached */
	Assert(false);
	return list;
}